

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.c
# Opt level: O2

LispPTR N_OP_lrsh8(LispPTR a)

{
  LispPTR LVar1;
  uint *NAddr;
  LispPTR *pLVar2;
  uint uVar3;
  
  if ((a & 0xfff0000) != 0xf0000) {
    if ((a & 0xfff0000) == 0xe0000) {
      uVar3 = a >> 8 & 0xff;
    }
    else {
      if ((*(ushort *)((ulong)(a >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        MachineState.tosvalue = a;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pLVar2 = NativeAligned4FromLAddr(a);
      uVar3 = *pLVar2 >> 8;
      if (0xffffff < *pLVar2) goto LAB_00129017;
    }
    return uVar3 | 0xe0000;
  }
  uVar3 = a >> 8 | 0xffff00;
LAB_00129017:
  NAddr = (uint *)createcell68k(2);
  *NAddr = uVar3;
  LVar1 = LAddrFromNative(NAddr);
  return LVar1;
}

Assistant:

LispPTR N_OP_lrsh8(LispPTR a) {
  int arg1;

  N_GETNUMBER(a, arg1, du_ufn);
  arg1 = (unsigned)arg1 >> 8;
  N_ARITH_SWITCH(arg1);

 du_ufn:
  ERROR_EXIT(a);
}